

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

bool __thiscall wallet::WalletBatch::WriteTx(WalletBatch *this,CWalletTx *wtx)

{
  element_type *peVar1;
  bool bVar2;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_transaction_identifier<false>_>
  pStack_68;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  peVar1 = (wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string
            ((string *)&pStack_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             DBKeys::TX_abi_cxx11_);
  pStack_68.second.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  pStack_68.second.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  pStack_68.second.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  pStack_68.second.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  bVar2 = WriteIC<std::pair<std::__cxx11::string,transaction_identifier<false>>,wallet::CWalletTx>
                    (this,&pStack_68,wtx,true);
  std::__cxx11::string::~string((string *)&pStack_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteTx(const CWalletTx& wtx)
{
    return WriteIC(std::make_pair(DBKeys::TX, wtx.GetHash()), wtx);
}